

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O3

ostream * operator<<(ostream *stream,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *structure)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  
  p_Var2 = *(_Rb_tree_node_base **)(structure + 0x18);
  if (p_Var2 != (_Rb_tree_node_base *)(structure + 8)) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(&local_68,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(p_Var2 + 1));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_68.first._M_dataplus._M_p,local_68.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      poVar1 = operator<<(poVar1,&local_68.second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
        operator_delete(local_68.first._M_dataplus._M_p,
                        local_68.first.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(structure + 8));
  }
  return stream;
}

Assistant:

std::ostream& operator <<(std::ostream& stream, std::map<std::string,std::vector<std::string>>& structure)
{
  std::for_each(structure.begin(),structure.end(),[&](auto pair){
    stream << pair.first << "\t" << pair.second << "\n";
  });
  return stream;
}